

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O2

xr_clsid * __thiscall xr_entity_factory::get_entity_clsid(xr_entity_factory *this,char *name)

{
  bool bVar1;
  xr_ini_file *this_00;
  anon_union_8_3_e9edf90f_for_xr_clsid_0 pred;
  __normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
  _Var2;
  xr_clsid local_20;
  
  this_00 = this->m_system_ini;
  if (this_00 == (xr_ini_file *)0x0) {
    this_00 = (xr_ini_file *)operator_new(0x18);
    xray_re::xr_ini_file::xr_ini_file(this_00,"$game_config$","system.ltx");
    this->m_system_ini = this_00;
  }
  bVar1 = xray_re::xr_ini_file::section_exist(this_00,name);
  if (bVar1) {
    pred.quad = xray_re::xr_ini_file::r_clsid(this->m_system_ini,name,"class");
    _Var2 = xray_re::
            lower_bound_if<__gnu_cxx::__normal_iterator<factory_item_base**,std::vector<factory_item_base*,std::allocator<factory_item_base*>>>,clsid_pred2>
                      ((__normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
                        )(this->m_clsids).
                         super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<factory_item_base_**,_std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>_>
                        )(this->m_clsids).
                         super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(clsid_pred2)pred);
    if ((_Var2._M_current !=
         (this->m_clsids).
         super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (((*_Var2._M_current)->m_clsid).field_0.quad == pred.quad)) {
      return &local_20;
    }
  }
  return (xr_clsid *)0x0;
}

Assistant:

xr_clsid* xr_entity_factory::get_entity_clsid(const char* name)
{
	if (m_system_ini == 0)
		m_system_ini = new xr_ini_file(PA_GAME_CONFIG, "system.ltx");
  
	if (m_system_ini->section_exist(name)) {
		xr_clsid clsid(m_system_ini->r_clsid(name, "class"));
		std::vector<factory_item_base*>::iterator it = lower_bound_if(
				m_clsids.begin(), m_clsids.end(), clsid_pred2(clsid));
		if (it != m_clsids.end() && (*it)->clsid() == clsid)
		{
			xr_clsid* temp = &clsid;
			return temp;
		}
	}

	return NULL;
}